

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O3

void TextElementBegin(textwriter *Out,textwriter *In,tchar_t *Element)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  wchar_t wVar4;
  tchar_t *Msg;
  
  if (In->HasChild == 0) {
    In->HasChild = 1;
    Msg = ">";
    if (In->InsideContent == 0) {
      Msg = ">\n";
    }
    TextWrite(In,Msg);
  }
  uVar1 = *(undefined4 *)((long)&In->Stream + 4);
  uVar2 = *(undefined4 *)&In->CC;
  uVar3 = *(undefined4 *)((long)&In->CC + 4);
  *(undefined4 *)&Out->Stream = *(undefined4 *)&In->Stream;
  *(undefined4 *)((long)&Out->Stream + 4) = uVar1;
  *(undefined4 *)&Out->CC = uVar2;
  *(undefined4 *)((long)&Out->CC + 4) = uVar3;
  Out->HasChild = 0;
  Out->SafeFormat = In->SafeFormat;
  wVar4 = In->Deep;
  Out->InsideContent = (ulong)(wVar4 == L'\0');
  wVar4 = wVar4 + L'\x02';
  if (In->InsideContent != 0) {
    wVar4 = L'\0';
  }
  Out->Deep = wVar4;
  Out->Element = Element;
  if (In->Deep == L'\0') {
    wVar4 = L'\0';
  }
  TextPrintf(Out,"%*c%s",(ulong)(uint)wVar4,0x3c,Element);
  return;
}

Assistant:

void TextElementBegin(textwriter* Out, textwriter* In, const tchar_t* Element)
{
    if (!In->HasChild)
    {
        In->HasChild = 1;
        if (In->InsideContent)
            TextWrite(In,T(">"));
        else
            TextWrite(In,T(">\n"));
    }
    Out->CC = In->CC;
    Out->Stream = In->Stream;
    Out->HasChild = 0;
    Out->SafeFormat = In->SafeFormat;
    Out->InsideContent = In->Deep==0;
    Out->Deep = In->InsideContent ? 0 : In->Deep+2;
    Out->Element = Element;
    TextPrintf(Out,T("%*c%s"),In->Deep?Out->Deep:0, '<',Element);
}